

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_StringUtilities.h
# Opt level: O3

string * __thiscall
choc::text::
replace<std::basic_string_view<char,std::char_traits<char>>,char_const(&)[3],char_const(&)[2]>
          (string *__return_storage_ptr__,text *this,
          basic_string_view<char,_std::char_traits<char>_> textToSearch,string_view firstToReplace,
          string_view firstReplacement,char (*otherPairsOfStringsToReplace) [3],
          char (*otherPairsOfStringsToReplace_1) [2])

{
  string_view firstReplacement_00;
  string_view firstToReplace_00;
  char (*in_stack_ffffffffffffffa8) [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,textToSearch._M_len,this + textToSearch._M_len);
  firstReplacement_00._M_str = *otherPairsOfStringsToReplace;
  firstReplacement_00._M_len = (size_t)firstToReplace._M_str;
  firstToReplace_00._M_str = (char *)firstReplacement._M_len;
  firstToReplace_00._M_len = firstToReplace._M_len;
  replace<std::__cxx11::string,char_const(&)[3],char_const(&)[2]>
            (__return_storage_ptr__,(text *)local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             textToSearch._M_str,firstToReplace_00,firstReplacement_00,
             (char (*) [3])firstReplacement._M_str,in_stack_ffffffffffffffa8);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string replace (StringType textToSearch, std::string_view firstToReplace, std::string_view firstReplacement,
                     OtherReplacements&&... otherPairsOfStringsToReplace)
{
    static_assert ((sizeof... (otherPairsOfStringsToReplace) & 1u) == 0,
                   "This function expects a list of pairs of strings as its arguments");

    if constexpr (std::is_same<const StringType, const std::string_view>::value || std::is_same<const StringType, const char* const>::value)
    {
        return replace (std::string (textToSearch), firstToReplace, firstReplacement,
                        std::forward<OtherReplacements> (otherPairsOfStringsToReplace)...);
    }
    else if constexpr (sizeof... (otherPairsOfStringsToReplace) == 0)
    {
        size_t pos = 0;

        for (;;)
        {
            pos = textToSearch.find (firstToReplace, pos);

            if (pos == std::string::npos)
                return textToSearch;

            textToSearch.replace (pos, firstToReplace.length(), firstReplacement);
            pos += firstReplacement.length();
        }
    }
    else
    {
        return replace (replace (std::move (textToSearch), firstToReplace, firstReplacement),
                        std::forward<OtherReplacements> (otherPairsOfStringsToReplace)...);
    }
}